

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

void jpeg_mem_dest(j_compress_ptr cinfo,uchar **outbuffer,unsigned_long *outsize)

{
  _func_boolean_j_compress_ptr *p_Var1;
  jpeg_destination_mgr *pjVar2;
  _func_void_j_compress_ptr *p_Var3;
  my_mem_dest_ptr dest;
  unsigned_long *outsize_local;
  uchar **outbuffer_local;
  j_compress_ptr cinfo_local;
  
  if ((outbuffer == (uchar **)0x0) || (outsize == (unsigned_long *)0x0)) {
    cinfo->err->msg_code = 0x18;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->dest == (jpeg_destination_mgr *)0x0) {
    pjVar2 = (jpeg_destination_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x50);
    cinfo->dest = pjVar2;
  }
  pjVar2 = cinfo->dest;
  pjVar2->init_destination = init_mem_destination;
  pjVar2->empty_output_buffer = empty_mem_output_buffer;
  pjVar2->term_destination = term_mem_destination;
  pjVar2[1].next_output_byte = (JOCTET *)outbuffer;
  pjVar2[1].free_in_buffer = (size_t)outsize;
  pjVar2[1].init_destination = (_func_void_j_compress_ptr *)0x0;
  if ((*outbuffer == (uchar *)0x0) || (*outsize == 0)) {
    p_Var3 = (_func_void_j_compress_ptr *)malloc(0x1000);
    *outbuffer = (uchar *)p_Var3;
    pjVar2[1].init_destination = p_Var3;
    if (pjVar2[1].init_destination == (_func_void_j_compress_ptr *)0x0) {
      cinfo->err->msg_code = 0x38;
      (cinfo->err->msg_parm).i[0] = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    *outsize = 0x1000;
  }
  p_Var1 = (_func_boolean_j_compress_ptr *)*outbuffer;
  pjVar2[1].empty_output_buffer = p_Var1;
  pjVar2->next_output_byte = (JOCTET *)p_Var1;
  p_Var3 = (_func_void_j_compress_ptr *)*outsize;
  pjVar2[1].term_destination = p_Var3;
  pjVar2->free_in_buffer = (size_t)p_Var3;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_dest (j_compress_ptr cinfo,
	       unsigned char ** outbuffer, unsigned long * outsize)
{
  my_mem_dest_ptr dest;

  if (outbuffer == NULL || outsize == NULL)	/* sanity check */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same buffer without re-executing jpeg_mem_dest.
   */
  if (cinfo->dest == NULL) {	/* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  SIZEOF(my_mem_destination_mgr));
  }

  dest = (my_mem_dest_ptr) cinfo->dest;
  dest->pub.init_destination = init_mem_destination;
  dest->pub.empty_output_buffer = empty_mem_output_buffer;
  dest->pub.term_destination = term_mem_destination;
  dest->outbuffer = outbuffer;
  dest->outsize = outsize;
  dest->newbuffer = NULL;

  if (*outbuffer == NULL || *outsize == 0) {
    /* Allocate initial buffer */
    dest->newbuffer = *outbuffer = (unsigned char *) malloc(OUTPUT_BUF_SIZE);
    if (dest->newbuffer == NULL)
      ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);
    *outsize = OUTPUT_BUF_SIZE;
  }

  dest->pub.next_output_byte = dest->buffer = *outbuffer;
  dest->pub.free_in_buffer = dest->bufsize = *outsize;
}